

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O3

vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> * __thiscall
ELFIO::elfio::get_ordered_segments
          (vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *__return_storage_ptr__,
          elfio *this)

{
  elfio *peVar1;
  pointer puVar2;
  segment *psVar3;
  bool bVar4;
  int iVar5;
  segment **ppsVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  _Elt_pointer ppsVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_> *seg;
  pointer puVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  segment *seg_1;
  deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> worklist;
  _Head_base<0UL,_ELFIO::segment_*,_false> local_80;
  _Deque_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> local_78;
  
  (__return_storage_ptr__->super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::_M_initialize_map
            (&local_78,0);
  peVar1 = (this->segments).parent;
  std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::reserve
            (__return_storage_ptr__,
             (ulong)((uint)(*(int *)&(peVar1->segments_).
                                     super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(peVar1->segments_).
                                    super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffff));
  peVar1 = (this->segments).parent;
  puVar13 = (peVar1->segments_).
            super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (peVar1->segments_).
           super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar13 != puVar2) {
    do {
      local_80._M_head_impl =
           (puVar13->_M_t).
           super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>._M_t.
           super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
           super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl;
      std::deque<ELFIO::segment*,std::allocator<ELFIO::segment*>>::emplace_back<ELFIO::segment*>
                ((deque<ELFIO::segment*,std::allocator<ELFIO::segment*>> *)&local_78,
                 &local_80._M_head_impl);
      puVar13 = puVar13 + 1;
    } while (puVar13 != puVar2);
  }
  lVar15 = 0;
  uVar9 = 0;
  uVar14 = 0;
  do {
    if (((long)local_78._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)local_78._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
        ((long)local_78._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)local_78._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
        ((((ulong)((long)local_78._M_impl.super__Deque_impl_data._M_finish._M_node -
                  (long)local_78._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(local_78._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
        0x40 <= uVar14) {
      if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_78._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          local_80._M_head_impl = *local_78._M_impl.super__Deque_impl_data._M_start._M_cur;
          if (local_78._M_impl.super__Deque_impl_data._M_start._M_cur ==
              local_78._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
            operator_delete(local_78._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
            local_78._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_78._M_impl.super__Deque_impl_data._M_start._M_node[1];
            local_78._M_impl.super__Deque_impl_data._M_start._M_last =
                 local_78._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
            local_78._M_impl.super__Deque_impl_data._M_start._M_first =
                 local_78._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_78._M_impl.super__Deque_impl_data._M_start._M_node =
                 local_78._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          }
          else {
            local_78._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_78._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
          }
          lVar15 = 0;
          uVar14 = 0;
          while( true ) {
            lVar16 = (long)local_78._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_78._M_impl.super__Deque_impl_data._M_start._M_node >> 3;
            lVar12 = (long)local_78._M_impl.super__Deque_impl_data._M_finish._M_cur -
                     (long)local_78._M_impl.super__Deque_impl_data._M_finish._M_first >> 3;
            lVar7 = (long)local_78._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)local_78._M_impl.super__Deque_impl_data._M_start._M_cur >> 3;
            if ((lVar16 + -1 +
                (ulong)(local_78._M_impl.super__Deque_impl_data._M_finish._M_node ==
                       (_Map_pointer)0x0)) * 0x40 + lVar12 + lVar7 <= uVar14) break;
            uVar9 = ((long)local_78._M_impl.super__Deque_impl_data._M_start._M_cur -
                     (long)local_78._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar14;
            if ((long)uVar9 < 0) {
              uVar10 = (long)uVar9 >> 6;
LAB_00108555:
              ppsVar6 = local_78._M_impl.super__Deque_impl_data._M_start._M_node[uVar10] +
                        uVar9 + uVar10 * -0x40;
            }
            else {
              if (0x3f < uVar9) {
                uVar10 = uVar9 >> 6;
                goto LAB_00108555;
              }
              ppsVar6 = (segment **)
                        ((long)local_78._M_impl.super__Deque_impl_data._M_start._M_cur + lVar15);
            }
            bVar4 = is_subsequence_of(local_80._M_head_impl,*ppsVar6);
            if (bVar4) {
              lVar16 = (long)local_78._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_78._M_impl.super__Deque_impl_data._M_start._M_node >> 3;
              lVar12 = (long)local_78._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)local_78._M_impl.super__Deque_impl_data._M_finish._M_first >> 3;
              lVar7 = (long)local_78._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_78._M_impl.super__Deque_impl_data._M_start._M_cur >> 3;
              break;
            }
            uVar14 = uVar14 + 1;
            lVar15 = lVar15 + 8;
          }
          if (uVar14 < lVar7 + lVar12 +
                       (lVar16 + -1 +
                       (ulong)(local_78._M_impl.super__Deque_impl_data._M_finish._M_node ==
                              (_Map_pointer)0x0)) * 0x40) {
            std::deque<ELFIO::segment*,std::allocator<ELFIO::segment*>>::
            emplace_back<ELFIO::segment*&>
                      ((deque<ELFIO::segment*,std::allocator<ELFIO::segment*>> *)&local_78,
                       &local_80._M_head_impl);
          }
          else {
            std::vector<ELFIO::segment*,std::allocator<ELFIO::segment*>>::
            emplace_back<ELFIO::segment*&>
                      ((vector<ELFIO::segment*,std::allocator<ELFIO::segment*>> *)
                       __return_storage_ptr__,&local_80._M_head_impl);
          }
        } while (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_78._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      std::_Deque_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::~_Deque_base(&local_78)
      ;
      return __return_storage_ptr__;
    }
    if (uVar14 != uVar9) {
      uVar10 = ((long)local_78._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)local_78._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar14;
      if ((long)uVar10 < 0) {
        uVar11 = (long)uVar10 >> 6;
LAB_001082f6:
        ppsVar6 = local_78._M_impl.super__Deque_impl_data._M_start._M_node[uVar11] +
                  uVar10 + uVar11 * -0x40;
      }
      else {
        if (0x3f < uVar10) {
          uVar11 = uVar10 >> 6;
          goto LAB_001082f6;
        }
        ppsVar6 = (segment **)
                  ((long)local_78._M_impl.super__Deque_impl_data._M_start._M_cur + lVar15);
      }
      iVar5 = (*(*ppsVar6)->_vptr_segment[0x18])();
      if ((char)iVar5 != '\0') {
        uVar10 = ((long)local_78._M_impl.super__Deque_impl_data._M_start._M_cur -
                  (long)local_78._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar14;
        if ((long)uVar10 < 0) {
          uVar11 = (long)uVar10 >> 6;
LAB_00108355:
          ppsVar6 = local_78._M_impl.super__Deque_impl_data._M_start._M_node[uVar11] +
                    uVar10 + uVar11 * -0x40;
        }
        else {
          if (0x3f < uVar10) {
            uVar11 = uVar10 >> 6;
            goto LAB_00108355;
          }
          ppsVar6 = (segment **)
                    ((long)local_78._M_impl.super__Deque_impl_data._M_start._M_cur + lVar15);
        }
        iVar5 = (*(*ppsVar6)->_vptr_segment[0x11])();
        if (CONCAT44(extraout_var,iVar5) == 0) {
          uVar10 = ((long)local_78._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_78._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar9;
          if ((long)uVar10 < 0) {
            uVar11 = (long)uVar10 >> 6;
LAB_001083b3:
            ppsVar8 = local_78._M_impl.super__Deque_impl_data._M_start._M_node[uVar11] +
                      uVar10 + uVar11 * -0x40;
          }
          else {
            if (0x3f < uVar10) {
              uVar11 = uVar10 >> 6;
              goto LAB_001083b3;
            }
            ppsVar8 = local_78._M_impl.super__Deque_impl_data._M_start._M_cur + uVar9;
          }
          iVar5 = (*(*ppsVar8)->_vptr_segment[0x11])();
          lVar16 = uVar9 + (CONCAT44(extraout_var_00,iVar5) == 0);
          lVar7 = (long)local_78._M_impl.super__Deque_impl_data._M_start._M_cur -
                  (long)local_78._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
          uVar9 = uVar14 + lVar7;
          if ((long)uVar9 < 0) {
            uVar10 = (long)uVar9 >> 6;
LAB_00108413:
            ppsVar6 = local_78._M_impl.super__Deque_impl_data._M_start._M_node[uVar10] +
                      uVar9 + uVar10 * -0x40;
          }
          else {
            if (0x3f < uVar9) {
              uVar10 = uVar9 >> 6;
              goto LAB_00108413;
            }
            ppsVar6 = (segment **)
                      ((long)local_78._M_impl.super__Deque_impl_data._M_start._M_cur + lVar15);
          }
          uVar9 = lVar7 + lVar16;
          if ((long)uVar9 < 0) {
            uVar10 = (long)uVar9 >> 6;
LAB_00108446:
            ppsVar8 = local_78._M_impl.super__Deque_impl_data._M_start._M_node[uVar10] +
                      uVar9 + uVar10 * -0x40;
          }
          else {
            if (0x3f < uVar9) {
              uVar10 = uVar9 >> 6;
              goto LAB_00108446;
            }
            ppsVar8 = local_78._M_impl.super__Deque_impl_data._M_start._M_cur + lVar16;
          }
          psVar3 = *ppsVar6;
          *ppsVar6 = *ppsVar8;
          *ppsVar8 = psVar3;
          uVar9 = lVar16 + 1;
        }
      }
    }
    uVar14 = uVar14 + 1;
    lVar15 = lVar15 + 8;
  } while( true );
}

Assistant:

std::vector<segment*> get_ordered_segments() const
    {
        std::vector<segment*> res;
        std::deque<segment*>  worklist;

        res.reserve( segments.size() );
        for ( const auto& seg : segments ) {
            worklist.emplace_back( seg.get() );
        }

        // Bring the segments which start at address 0 to the front
        size_t nextSlot = 0;
        for ( size_t i = 0; i < worklist.size(); ++i ) {
            if ( i != nextSlot && worklist[i]->is_offset_initialized() &&
                 worklist[i]->get_offset() == 0 ) {
                if ( worklist[nextSlot]->get_offset() == 0 ) {
                    ++nextSlot;
                }
                std::swap( worklist[i], worklist[nextSlot] );
                ++nextSlot;
            }
        }

        while ( !worklist.empty() ) {
            segment* seg = worklist.front();
            worklist.pop_front();

            size_t i = 0;
            for ( ; i < worklist.size(); ++i ) {
                if ( is_subsequence_of( seg, worklist[i] ) ) {
                    break;
                }
            }

            if ( i < worklist.size() ) {
                worklist.emplace_back( seg );
            }
            else {
                res.emplace_back( seg );
            }
        }

        return res;
    }